

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

void __thiscall
async_simple::coro::detail::LazyPromise<void>::unhandled_exception(LazyPromise<void> *this)

{
  exception_ptr eStack_18;
  
  std::current_exception();
  std::__exception_ptr::exception_ptr::operator=(&this->_exception,&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  return;
}

Assistant:

void unhandled_exception() noexcept {
        _exception = std::current_exception();
    }